

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoin-cli.cpp
# Opt level: O0

UniValue * __thiscall
AddrinfoRequestHandler::PrepareRequest
          (AddrinfoRequestHandler *this,string *method,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  runtime_error *this_00;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  UniValue params;
  UniValue *in_stack_fffffffffffffde8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdf8;
  allocator_type *in_stack_fffffffffffffe20;
  UniValue *val;
  allocator<char> *in_stack_fffffffffffffe28;
  UniValue *this_01;
  string *in_stack_fffffffffffffe30;
  UniValue *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  UniValue *id;
  UniValue *params_00;
  string *strMethod;
  allocator<char> local_13b;
  UniValue local_13a;
  undefined1 local_a0 [152];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(in_stack_fffffffffffffdf8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28
              );
    params_00 = (UniValue *)local_a0;
    strMethod = (string *)((long)&local_13a.typ + 1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28
              );
    id = &local_13a;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffffde8);
    __l._M_len = (size_type)id;
    __l._M_array = in_stack_fffffffffffffe30;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffe28,__l,in_stack_fffffffffffffe20);
    RPCConvertValues(in_stack_fffffffffffffe30,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffe28);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_fffffffffffffdf8);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffde8);
    this_01 = (UniValue *)local_a0;
    val = (UniValue *)(local_a0 + 0x20);
    do {
      val = (UniValue *)
            &val[-1].keys.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffde8);
    } while (val != this_01);
    __s = val;
    std::allocator<char>::~allocator((allocator<char> *)((long)&local_13a.typ + 1));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffde8);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)local_13a.val.field_2._M_local_buf + 9));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)id,(char *)__s,
               (allocator<char> *)this_01);
    UniValue::UniValue<int,_int,_true>(this_01,(int *)val);
    JSONRPCRequestObj(strMethod,params_00,id);
    UniValue::~UniValue(in_stack_fffffffffffffde8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffde8);
    std::allocator<char>::~allocator(&local_13b);
    UniValue::~UniValue(in_stack_fffffffffffffde8);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return in_RDI;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"-addrinfo takes no arguments");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

UniValue PrepareRequest(const std::string& method, const std::vector<std::string>& args) override
    {
        if (!args.empty()) {
            throw std::runtime_error("-addrinfo takes no arguments");
        }
        UniValue params{RPCConvertValues("getnodeaddresses", std::vector<std::string>{{"0"}})};
        return JSONRPCRequestObj("getnodeaddresses", params, 1);
    }